

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

char * cs_md5(char *buf,...)

{
  char in_AL;
  uint uVar1;
  ulong uVar2;
  undefined8 in_RCX;
  undefined8 *puVar3;
  size_t *psVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar hash [16];
  MD5_CTX local_128;
  size_t local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_128.A = 0x67452301;
  local_128.B = 0xefcdab89;
  local_128.C = 0x98badcfe;
  local_128.D = 0x10325476;
  local_128.Nl = 0;
  local_128.Nh = 0;
  uVar1 = 8;
  ap[0].overflow_arg_area = &stack0x00000008;
  local_c8[1] = in_RSI;
  local_c8[2] = in_RDX;
  local_c8[3] = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if (uVar2 < 0x29) {
      puVar3 = (undefined8 *)((long)local_c8 + uVar2);
      uVar1 = uVar1 + 8;
      uVar2 = (ulong)uVar1;
    }
    else {
      puVar3 = (undefined8 *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    if ((void *)*puVar3 == (void *)0x0) break;
    if ((uint)uVar2 < 0x29) {
      uVar1 = (uint)uVar2 + 8;
      psVar4 = (size_t *)((long)local_c8 + uVar2);
    }
    else {
      psVar4 = (size_t *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    MD5_Update(&local_128,(void *)*puVar3,*psVar4);
  }
  MD5_Final(hash,&local_128);
  cs_to_hex(buf,hash,0x10);
  return buf;
}

Assistant:

char *cs_md5(char buf[33], ...) {
    unsigned char hash[16];
    const unsigned char *p;
    va_list ap;
    MD5_CTX ctx;

    MD5_Init(&ctx);

    va_start(ap, buf);
    while ((p = va_arg(ap, const unsigned char *)) != NULL) {
        size_t len = va_arg(ap, size_t);
        MD5_Update(&ctx, p, len);
    }
    va_end(ap);

    MD5_Final(hash, &ctx);
    cs_to_hex(buf, hash, sizeof(hash));

    return buf;
}